

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

RuleBasedBreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::refreshInputText
          (RuleBasedBreakIterator *this,UText *input,UErrorCode *status)

{
  UBool UVar1;
  int64_t index;
  int64_t iVar2;
  int64_t pos;
  UErrorCode *status_local;
  UText *input_local;
  RuleBasedBreakIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (input == (UText *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      index = utext_getNativeIndex_63(&this->fText);
      utext_clone_63(&this->fText,input,'\0','\x01',status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        utext_setNativeIndex_63(&this->fText,index);
        iVar2 = utext_getNativeIndex_63(&this->fText);
        if (iVar2 != index) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
      }
    }
  }
  return this;
}

Assistant:

RuleBasedBreakIterator &RuleBasedBreakIterator::refreshInputText(UText *input, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (input == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    int64_t pos = utext_getNativeIndex(&fText);
    //  Shallow read-only clone of the new UText into the existing input UText
    utext_clone(&fText, input, FALSE, TRUE, &status);
    if (U_FAILURE(status)) {
        return *this;
    }
    utext_setNativeIndex(&fText, pos);
    if (utext_getNativeIndex(&fText) != pos) {
        // Sanity check.  The new input utext is supposed to have the exact same
        // contents as the old.  If we can't set to the same position, it doesn't.
        // The contents underlying the old utext might be invalid at this point,
        // so it's not safe to check directly.
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}